

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O2

bool dg::llvmutils::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  const_arg_iterator pAVar4;
  const_arg_iterator pAVar5;
  CallInst *pCVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = llvm::CallBase::arg_size((CallBase *)CI);
  uVar7 = (ulong)uVar3;
  if (policy == MATCHING_ARGS) {
LAB_00120171:
    pAVar4 = llvm::Function::arg_begin(F);
    pAVar5 = llvm::Function::arg_end(F);
    uVar8 = 0;
    pCVar6 = CI;
    for (; bVar1 = pAVar4 == pAVar5 || uVar7 <= uVar8, pAVar4 != pAVar5 && uVar7 > uVar8;
        pAVar4 = pAVar4 + 0x28) {
      if ((((*(uint *)((Type *)**(undefined8 **)(pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))
                      + 8) & 0xfd) != 0xd) || ((*(uint *)(*(long *)pAVar4 + 8) & 0xfd) != 0xd)) &&
         (cVar2 = llvm::Type::canLosslesslyBitCastTo
                            ((Type *)**(undefined8 **)
                                       (pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))),
         cVar2 == '\0')) {
        return bVar1;
      }
      uVar8 = uVar8 + 1;
      pCVar6 = pCVar6 + 0x20;
    }
  }
  else {
    uVar8 = *(ulong *)(F + 0x60);
    if (*(uint *)(*(long *)(F + 0x18) + 8) < 0x100) {
      if ((uVar8 == uVar7) || (uVar8 <= uVar7 && policy != STRICT)) goto LAB_00120159;
    }
    else if (uVar8 <= uVar7) {
LAB_00120159:
      cVar2 = llvm::Type::canLosslesslyBitCastTo
                        ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10));
      if ((cVar2 != '\0') ||
         (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) == 0xd &&
          ((*(uint *)(*(long *)CI + 8) & 0xfd) == 0xd)))) goto LAB_00120171;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool
callIsCompatible(const Function *F, const CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

    auto ci_arg_size = getNumArgOperands(CI);
    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > ci_arg_size) {
                return false;
            }
        } else if (F->arg_size() != ci_arg_size) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > ci_arg_size) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < ci_arg_size && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}